

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRackpinion.cpp
# Opt level: O2

void __thiscall chrono::ChLinkRackpinion::ArchiveOUT(ChLinkRackpinion *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChFrame<double>_> local_d8;
  ChNameValue<chrono::ChFrame<double>_> local_c0;
  ChNameValue<double> local_a8;
  ChNameValue<bool> local_90;
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkRackpinion>(marchive);
  ChLinkMateGeneric::ArchiveOUT(&this->super_ChLinkMateGeneric,marchive);
  local_30._value = &this->R;
  local_30._name = "R";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->alpha;
  local_48._name = "alpha";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->beta;
  local_60._name = "beta";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &this->phase;
  local_78._name = "phase";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  local_90._value = &this->checkphase;
  local_90._name = "checkphase";
  local_90._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_90);
  local_a8._value = &this->a1;
  local_a8._name = "a1";
  local_a8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_a8);
  local_c0._value = &this->local_pinion;
  local_c0._name = "local_pinion";
  local_c0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_c0);
  local_d8._value = &this->local_rack;
  local_d8._name = "local_rack";
  local_d8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_d8);
  return;
}

Assistant:

void ChLinkRackpinion::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkRackpinion>();

    // serialize parent class
    ChLinkMateGeneric::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(R);
    marchive << CHNVP(alpha);
    marchive << CHNVP(beta);
    marchive << CHNVP(phase);
    marchive << CHNVP(checkphase);
    marchive << CHNVP(a1);
    marchive << CHNVP(local_pinion);
    marchive << CHNVP(local_rack);
}